

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test::TestBody
          (UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  ShortSooRep *this_00;
  ShortSooRep *this_01;
  long lVar4;
  UnknownFieldSet rhs_stack;
  UnknownFieldSet lhs_stack;
  Arena arena;
  char local_10c [4];
  ShortSooRep local_108;
  ShortSooRep local_f8;
  long local_e0;
  ThreadSafeArena local_d8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_d8);
  local_10c[2] = '\0';
  local_10c[3] = '\x01';
  lVar4 = 0;
  do {
    local_e0 = lVar4;
    cVar1 = local_10c[lVar4 + 2];
    local_10c[0] = '\0';
    local_10c[1] = '\x01';
    lVar4 = 0;
    do {
      cVar2 = local_10c[lVar4];
      local_f8.arena_and_size = 0;
      local_f8.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      local_108.arena_and_size = 0;
      local_108.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      this_00 = &local_f8;
      if (cVar1 != '\0') {
        this_00 = (ShortSooRep *)Arena::Allocate((Arena *)&local_d8,0x10);
        protobuf::internal::ShortSooRep::ShortSooRep(this_00,(Arena *)&local_d8);
      }
      this_01 = &local_108;
      if (cVar2 != '\0') {
        this_01 = (ShortSooRep *)Arena::Allocate((Arena *)&local_d8,0x10);
        protobuf::internal::ShortSooRep::ShortSooRep(this_01,(Arena *)&local_d8);
      }
      PopulateUFS((UnknownFieldSet *)this_01);
      UnknownFieldSet::MergeFrom((UnknownFieldSet *)this_00,(UnknownFieldSet *)this_01);
      iVar3 = protobuf::internal::SooRep::size
                        ((SooRep *)&local_108,(local_108.arena_and_size & 4) == 0);
      if (iVar3 != 0) {
        UnknownFieldSet::ClearFallback((UnknownFieldSet *)&local_108);
      }
      RepeatedField<google::protobuf::UnknownField>::~RepeatedField
                ((RepeatedField<google::protobuf::UnknownField> *)&local_108);
      iVar3 = protobuf::internal::SooRep::size
                        ((SooRep *)&local_f8,(local_f8.arena_and_size & 4) == 0);
      if (iVar3 != 0) {
        UnknownFieldSet::ClearFallback((UnknownFieldSet *)&local_f8);
      }
      RepeatedField<google::protobuf::UnknownField>::~RepeatedField
                ((RepeatedField<google::protobuf::UnknownField> *)&local_f8);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar4 = local_e0 + 1;
  } while (lVar4 != 2);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, ArenaSupportWorksWithMergeFrom) {
  Arena arena;

  for (bool lhs_arena : {false, true}) {
    for (bool rhs_arena : {false, true}) {
      UnknownFieldSet lhs_stack, rhs_stack;
      auto& lhs =
          lhs_arena ? *Arena::Create<UnknownFieldSet>(&arena) : lhs_stack;
      auto& rhs =
          rhs_arena ? *Arena::Create<UnknownFieldSet>(&arena) : rhs_stack;
      PopulateUFS(rhs);
      lhs.MergeFrom(rhs);
    }
  }
}